

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O1

bool __thiscall llvm::StringRef::getAsInteger(StringRef *this,uint Radix,APInt *Result)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  APInt *this_00;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  size_t sVar7;
  uint ShiftAmt;
  uint numBits;
  byte *pbVar8;
  uint uVar9;
  uint64_t val;
  uint uVar10;
  ulong RHS;
  bool bVar11;
  APInt RadixAP;
  APInt CharAP;
  StringRef local_88;
  anon_union_8_2_1313ab2f_for_U local_70;
  uint local_68;
  anon_union_8_2_1313ab2f_for_U local_60;
  uint local_58;
  APInt *local_50;
  uint64_t local_48;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  val = (uint64_t)Radix;
  local_88.Data = this->Data;
  local_88.Length = this->Length;
  if (Radix == 0) {
    uVar4 = GetAutoSenseRadix(&local_88);
    val = (uint64_t)uVar4;
  }
  uVar4 = (uint)val;
  if (0x22 < uVar4 - 2) {
    __assert_fail("Radix > 1 && Radix <= 36",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/StringRef.cpp"
                  ,0x204,"bool llvm::StringRef::getAsInteger(unsigned int, APInt &) const");
  }
  if (local_88.Length == 0) {
    bVar11 = true;
  }
  else {
    bVar11 = local_88.Length == 0;
    if (!bVar11) {
      if (*local_88.Data == 0x30) {
        pbVar8 = (byte *)(local_88.Data + local_88.Length);
        pbVar6 = (byte *)local_88.Data;
        do {
          bVar11 = local_88.Length == 1;
          if (bVar11) {
            local_88.Length = 0;
            local_88.Data = (char *)pbVar8;
            goto LAB_0018737a;
          }
          local_88.Data = (char *)(pbVar6 + 1);
          local_88.Length = local_88.Length - 1;
          pbVar1 = pbVar6 + 1;
          pbVar6 = (byte *)local_88.Data;
        } while (*pbVar1 == 0x30);
      }
      if (!bVar11) {
        uVar10 = -(int)local_88.Length;
        ShiftAmt = 0xffffffff;
        do {
          ShiftAmt = ShiftAmt + 1;
          uVar9 = 1 << ((byte)ShiftAmt & 0x1f);
          uVar10 = uVar10 + (int)local_88.Length;
        } while (uVar9 < uVar4);
        uVar3 = Result->BitWidth;
        numBits = uVar3;
        if ((uVar3 <= uVar10) && (numBits = uVar10, uVar3 < uVar10)) {
          APInt::zext((APInt *)&local_70,(uint)Result);
          APInt::operator=(Result,(APInt *)&local_70);
          if ((0x40 < local_68) && ((void *)local_70.VAL != (void *)0x0)) {
            operator_delete__(local_70.pVal);
          }
        }
        local_68 = 1;
        local_70.VAL = 0;
        local_58 = 1;
        local_60.VAL = 0;
        if (uVar9 != uVar4) {
          APInt::APInt((APInt *)&local_40,numBits,val,false);
          APInt::operator=((APInt *)&local_70,(APInt *)&local_40);
          if ((0x40 < local_38) && ((void *)local_40.VAL != (void *)0x0)) {
            operator_delete__(local_40.pVal);
          }
          APInt::APInt((APInt *)&local_40,numBits,0,false);
          APInt::operator=((APInt *)&local_60,(APInt *)&local_40);
          if ((0x40 < local_38) && ((void *)local_40.VAL != (void *)0x0)) {
            operator_delete__(local_40.pVal);
          }
        }
        local_50 = Result;
        APInt::operator=(Result,0);
        bVar11 = local_88.Length != 0;
        sVar7 = local_88.Length;
        pbVar8 = (byte *)local_88.Data;
        if (bVar11) {
          do {
            local_48 = val;
            this_00 = local_50;
            bVar2 = *pbVar8;
            iVar5 = -0x30;
            if (((9 < (byte)(bVar2 - 0x30)) && (iVar5 = -0x57, 0x19 < (byte)(bVar2 + 0x9f))) &&
               (iVar5 = -0x37, 0x19 < (byte)(bVar2 + 0xbf))) goto LAB_00187338;
            if ((uint)local_48 <= iVar5 + (uint)bVar2) goto LAB_00187338;
            RHS = (ulong)(iVar5 + (uint)bVar2);
            if (uVar9 == (uint)local_48) {
              APInt::operator<<=(local_50,ShiftAmt);
              if (this_00->BitWidth < 0x41) {
                (this_00->U).VAL = (this_00->U).VAL | RHS;
                APInt::clearUnusedBits(this_00);
              }
              else {
                *(this_00->U).pVal = *(this_00->U).pVal | RHS;
              }
            }
            else {
              APInt::operator*=(local_50,(APInt *)&local_70);
              APInt::operator=((APInt *)&local_60,RHS);
              APInt::operator+=(this_00,(APInt *)&local_60);
            }
            pbVar8 = pbVar8 + 1;
            bVar11 = sVar7 - 1 != 0;
            sVar7 = sVar7 - 1;
            val = local_48;
          } while (bVar11);
          sVar7 = 0;
        }
LAB_00187338:
        local_88.Data = (char *)pbVar8;
        local_88.Length = sVar7;
        if ((0x40 < local_58) && ((void *)local_60.VAL != (void *)0x0)) {
          operator_delete__(local_60.pVal);
        }
        if (local_68 < 0x41) {
          return bVar11;
        }
        if ((void *)local_70.VAL == (void *)0x0) {
          return bVar11;
        }
        operator_delete__(local_70.pVal);
        return bVar11;
      }
    }
LAB_0018737a:
    local_68 = 0x40;
    local_70.VAL = 0;
    APInt::operator=(Result,(APInt *)&local_70);
    if ((0x40 < local_68) && ((void *)local_70.VAL != (void *)0x0)) {
      operator_delete__(local_70.pVal);
    }
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool StringRef::getAsInteger(unsigned Radix, APInt &Result) const {
  StringRef Str = *this;

  // Autosense radix if not specified.
  if (Radix == 0)
    Radix = GetAutoSenseRadix(Str);

  assert(Radix > 1 && Radix <= 36);

  // Empty strings (after the radix autosense) are invalid.
  if (Str.empty()) return true;

  // Skip leading zeroes.  This can be a significant improvement if
  // it means we don't need > 64 bits.
  while (!Str.empty() && Str.front() == '0')
    Str = Str.substr(1);

  // If it was nothing but zeroes....
  if (Str.empty()) {
    Result = APInt(64, 0);
    return false;
  }

  // (Over-)estimate the required number of bits.
  unsigned Log2Radix = 0;
  while ((1U << Log2Radix) < Radix) Log2Radix++;
  bool IsPowerOf2Radix = ((1U << Log2Radix) == Radix);

  unsigned BitWidth = Log2Radix * Str.size();
  if (BitWidth < Result.getBitWidth())
    BitWidth = Result.getBitWidth(); // don't shrink the result
  else if (BitWidth > Result.getBitWidth())
    Result = Result.zext(BitWidth);

  APInt RadixAP, CharAP; // unused unless !IsPowerOf2Radix
  if (!IsPowerOf2Radix) {
    // These must have the same bit-width as Result.
    RadixAP = APInt(BitWidth, Radix);
    CharAP = APInt(BitWidth, 0);
  }

  // Parse all the bytes of the string given this radix.
  Result = 0;
  while (!Str.empty()) {
    unsigned CharVal;
    if (Str[0] >= '0' && Str[0] <= '9')
      CharVal = Str[0]-'0';
    else if (Str[0] >= 'a' && Str[0] <= 'z')
      CharVal = Str[0]-'a'+10;
    else if (Str[0] >= 'A' && Str[0] <= 'Z')
      CharVal = Str[0]-'A'+10;
    else
      return true;

    // If the parsed value is larger than the integer radix, the string is
    // invalid.
    if (CharVal >= Radix)
      return true;

    // Add in this character.
    if (IsPowerOf2Radix) {
      Result <<= Log2Radix;
      Result |= CharVal;
    } else {
      Result *= RadixAP;
      CharAP = CharVal;
      Result += CharAP;
    }

    Str = Str.substr(1);
  }

  return false;
}